

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_constants_mon_play(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"break-glyph");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x48) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"mult-rate");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x4a) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"life-drain");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x4c) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"flee-range");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x4e) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"turn-range");
            if (iVar2 != 0) {
              return PARSE_ERROR_UNDEFINED_DIRECTIVE;
            }
            *(undefined2 *)((long)pvVar4 + 0x50) = uVar5;
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_mon_play(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "break-glyph"))
		z->glyph_hardness = value;
	else if (streq(label, "mult-rate"))
		z->repro_monster_rate = value;
	else if (streq(label, "life-drain"))
		z->life_drain_percent = value;
	else if (streq(label, "flee-range"))
		z->flee_range = value;
	else if (streq(label, "turn-range"))
		z->turn_range = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}